

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

string * __thiscall Node::OutputBstringText_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  string *this_00;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->Type == 0x1d4) {
    Expression_abi_cxx11_(&local_70,this);
    std::operator+(&local_50,"std::string(",&local_70);
    std::operator+(&local_30,&local_50,")");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = &local_70;
  }
  else {
    Expression_abi_cxx11_(&local_30,this);
    this_00 = &local_30;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)this_00);
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string Node::OutputBstringText(void)
{
	std::string result;

	switch(Type)
	{
	case BAS_V_TEXTSTRING:
		result = "std::string(" + Expression() + ")";
		break;

	default:
		result = Expression();
		break;
	}

	return result;
}